

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adf.cpp
# Opt level: O3

bool ReadADF(MemFile *file,shared_ptr<Disk> *disk)

{
  Disk *this;
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  ulong uVar6;
  Data *data;
  uint uVar7;
  size_t in_RCX;
  uint uVar8;
  char *__stream;
  Format *new_fmt;
  Format fmtHD;
  Format fmtDD;
  uint8_t bootblock [1024];
  Format local_4b0;
  Format local_474;
  FILE local_438 [4];
  
  Format::Format(&local_474,AmigaDOS);
  Format::Format(&local_4b0,AmigaDOSHD);
  iVar3 = MemFile::size(file);
  iVar4 = Format::disk_size(&local_474);
  if (iVar3 != iVar4) {
    iVar3 = MemFile::size(file);
    iVar4 = Format::disk_size(&local_4b0);
    if (iVar3 != iVar4) {
      return false;
    }
  }
  bVar2 = MemFile::seek(file,0);
  if (!bVar2) {
    return false;
  }
  __stream = (char *)local_438;
  sVar5 = MemFile::read(file,(int)__stream,(void *)0x400,in_RCX);
  if ((char)sVar5 == '\0') {
    return false;
  }
  uVar8 = 0;
  if ((local_438[0]._flags & 0xffffffU) == 0x534f44) {
    uVar6 = 0xfffffffffffffffc;
    do {
      uVar7 = *(uint *)(local_438[0]._shortbuf + (uVar6 - 0x7f));
      uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
      uVar8 = uVar8 + uVar7 + (uint)CARRY4(uVar8,uVar7);
      uVar6 = uVar6 + 4;
    } while (uVar6 < 0x3fc);
    if (uVar8 != 0xffffffff) {
      __stream = "invalid AmigaDOS root block checksum";
      Message<>(msgWarning,"invalid AmigaDOS root block checksum");
    }
    MemFile::rewind(file,(FILE *)__stream);
    this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar3 = MemFile::size(file);
    iVar4 = Format::disk_size(&local_474);
    new_fmt = &local_4b0;
    if (iVar3 == iVar4) {
      new_fmt = &local_474;
    }
    data = MemFile::data(file);
    Disk::format(this,new_fmt,data,true);
    peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::_M_replace
              ((ulong)&peVar1->strType,0,(char *)(peVar1->strType)._M_string_length,0x1b0d68);
    return true;
  }
  return false;
}

Assistant:

bool ReadADF(MemFile& file, std::shared_ptr<Disk>& disk)
{
    Format fmtDD{ RegularFormat::AmigaDOS };
    Format fmtHD{ RegularFormat::AmigaDOSHD };

    if (file.size() != fmtDD.disk_size() && file.size() != fmtHD.disk_size())
        return false;

    uint8_t bootblock[ADF_BOOTBLOCK_SIZE];
    auto pbb = reinterpret_cast<const ADF_BOOTBLOCK*>(bootblock);

    if (!file.seek(0) || !file.read(&bootblock, sizeof(bootblock)))
        return false;

    // Check for AmigaDOS signature
    if ((util::betoh(pbb->disk_type) & 0xffffff00) != 0x444f5300)
        return false;

    uint32_t checksum = 0;
    for (size_t i = 0; i < sizeof(bootblock); i += sizeof(uint32_t))
    {
        auto prev = checksum;

        checksum += util::betoh(*reinterpret_cast<uint32_t*>(bootblock + i));
        if (checksum < prev)
            checksum++;
    }

    if (~checksum)
        Message(msgWarning, "invalid AmigaDOS root block checksum");;

    file.rewind();
    disk->format(file.size() == fmtDD.disk_size() ? fmtDD : fmtHD, file.data(), true);
    disk->strType = "ADF";

    return true;
}